

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O1

void __thiscall FIX::HttpConnection::processRequest(HttpConnection *this,HttpMessage *request)

{
  _func_int **pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  bool bVar4;
  undefined *puVar5;
  int iVar6;
  TAG *pTVar7;
  size_t sVar8;
  long *plVar9;
  undefined8 *puVar10;
  ulong *puVar11;
  size_type *psVar12;
  stringstream *h_00;
  undefined8 uVar13;
  ulong uVar14;
  HttpConnection *pHVar15;
  string titleString;
  TITLE title;
  string response;
  stringstream h;
  stringstream b;
  BODY body;
  string local_8f0;
  HttpConnection *local_8d0;
  long *local_8c8;
  long local_8c0;
  long local_8b8 [2];
  ulong *local_8a8;
  long local_8a0;
  ulong local_898 [2];
  long *local_888 [2];
  long local_878 [2];
  undefined1 local_868 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_850 [2];
  ostream local_830 [376];
  ostream *local_6b8;
  TAG local_6b0;
  stringstream local_4f8 [16];
  long local_4e8 [14];
  ios_base aiStack_478 [264];
  stringstream local_370 [16];
  ostream local_360 [112];
  ios_base aiStack_2f0 [264];
  TAG local_1e8;
  
  local_8d0 = this;
  std::__cxx11::stringstream::stringstream(local_4f8);
  std::__cxx11::stringstream::stringstream(local_370);
  local_8c8 = local_8b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8c8,"QuickFIX Engine Web Interface","");
  HTML::HEAD::HEAD((HEAD *)&local_1e8,(ostream *)local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1e8.m_stream,">",1);
  HTML::CENTER::CENTER((CENTER *)&local_6b0,(ostream *)local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>(local_6b0.m_stream,">",1);
  HTML::TITLE::TITLE((TITLE *)local_868,(ostream *)local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>(local_830,(char *)local_8c8,local_8c0);
  std::__ostream_insert<char,std::char_traits<char>>(local_6b8,">",1);
  HTML::TAG::~TAG((TAG *)local_868);
  HTML::H1::H1((H1 *)local_868,(ostream *)local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>(local_830,(char *)local_8c8,local_8c0);
  std::__ostream_insert<char,std::char_traits<char>>(local_6b8,">",1);
  HTML::TAG::~TAG((TAG *)local_868);
  HTML::TAG::~TAG(&local_6b0);
  HTML::CENTER::CENTER((CENTER *)&local_6b0,(ostream *)local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>(local_6b0.m_stream,">",1);
  HTML::A::A((A *)local_868,(ostream *)local_4e8);
  paVar2 = &local_8f0.field_2;
  local_8f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"/","");
  pTVar7 = &HTML::A::href((A *)local_868,&local_8f0)->super_TAG;
  HTML::TAG::text<char[5]>(pTVar7,(char (*) [5])"HOME");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_868);
  puVar5 = HTML::NBSP;
  if (HTML::NBSP == (undefined *)0x0) {
    std::ios::clear((int)*(undefined8 *)(local_4e8[0] + -0x18) + (int)(ostream *)local_4e8);
  }
  else {
    sVar8 = strlen(HTML::NBSP);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e8,puVar5,sVar8);
  }
  HTML::A::A((A *)local_868,(ostream *)local_4e8);
  HttpMessage::toString_abi_cxx11_(&local_8f0,request);
  pTVar7 = &HTML::A::href((A *)local_868,&local_8f0)->super_TAG;
  HTML::TAG::text<char[7]>(pTVar7,(char (*) [7])"RELOAD");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  HTML::TAG::~TAG((TAG *)local_868);
  HTML::TAG::~TAG(&local_6b0);
  HTML::HR::HR((HR *)&local_6b0,(ostream *)local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>(local_6b0.m_stream,">",1);
  HTML::TAG::~TAG(&local_6b0);
  HTML::TAG::~TAG(&local_1e8);
  HTML::BODY::BODY((BODY *)&local_1e8,local_360);
  std::__ostream_insert<char,std::char_traits<char>>(local_1e8.m_stream,">",1);
  pHVar15 = (HttpConnection *)request;
  iVar6 = std::__cxx11::string::compare((char *)request);
  if (iVar6 == 0) {
    processRoot(pHVar15,request,h_00,(stringstream *)local_370);
LAB_0017b9c9:
    iVar6 = 200;
    bVar4 = true;
  }
  else {
    pHVar15 = (HttpConnection *)request;
    iVar6 = std::__cxx11::string::compare((char *)request);
    if (iVar6 == 0) {
      processResetSessions(pHVar15,request,(stringstream *)local_4f8,(stringstream *)local_370);
      goto LAB_0017b9c9;
    }
    pHVar15 = (HttpConnection *)request;
    iVar6 = std::__cxx11::string::compare((char *)request);
    if (iVar6 == 0) {
      processRefreshSessions(pHVar15,request,(stringstream *)local_4f8,(stringstream *)local_370);
      goto LAB_0017b9c9;
    }
    pHVar15 = (HttpConnection *)request;
    iVar6 = std::__cxx11::string::compare((char *)request);
    if (iVar6 == 0) {
      processEnableSessions(pHVar15,request,(stringstream *)local_4f8,(stringstream *)local_370);
      goto LAB_0017b9c9;
    }
    pHVar15 = (HttpConnection *)request;
    iVar6 = std::__cxx11::string::compare((char *)request);
    if (iVar6 == 0) {
      processDisableSessions(pHVar15,request,(stringstream *)local_4f8,(stringstream *)local_370);
      goto LAB_0017b9c9;
    }
    iVar6 = std::__cxx11::string::compare((char *)request);
    if (iVar6 == 0) {
      processSession(local_8d0,request,(stringstream *)local_4f8,(stringstream *)local_370);
      goto LAB_0017b9c9;
    }
    pHVar15 = (HttpConnection *)request;
    iVar6 = std::__cxx11::string::compare((char *)request);
    if (iVar6 == 0) {
      processResetSession(pHVar15,request,(stringstream *)local_4f8,(stringstream *)local_370);
      goto LAB_0017b9c9;
    }
    pHVar15 = (HttpConnection *)request;
    iVar6 = std::__cxx11::string::compare((char *)request);
    if (iVar6 == 0) {
      processRefreshSession(pHVar15,request,(stringstream *)local_4f8,(stringstream *)local_370);
      goto LAB_0017b9c9;
    }
    iVar6 = 0x194;
    bVar4 = false;
  }
  std::__cxx11::stringbuf::str();
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_888,0,(char *)0x0,0x1cb451);
  puVar11 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_8f0.field_2._M_allocated_capacity = *puVar11;
    local_8f0.field_2._8_8_ = plVar9[3];
    local_8f0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_8f0.field_2._M_allocated_capacity = *puVar11;
    local_8f0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_8f0._M_string_length = plVar9[1];
  *plVar9 = (long)puVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::stringbuf::str();
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != paVar2) {
    uVar13 = local_8f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_8a0 + local_8f0._M_string_length) {
    uVar14 = 0xf;
    if (local_8a8 != local_898) {
      uVar14 = local_898[0];
    }
    if (local_8a0 + local_8f0._M_string_length <= uVar14) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_8a8,0,(char *)0x0,(ulong)local_8f0._M_dataplus._M_p);
      goto LAB_0017bab2;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8f0,(ulong)local_8a8);
LAB_0017bab2:
  local_868._0_8_ = local_868 + 0x10;
  pp_Var1 = (_func_int **)(puVar10 + 2);
  if ((_func_int **)*puVar10 == pp_Var1) {
    local_868._16_8_ = *pp_Var1;
    aaStack_850[0]._0_8_ = puVar10[3];
  }
  else {
    local_868._16_8_ = *pp_Var1;
    local_868._0_8_ = (_func_int **)*puVar10;
  }
  local_868._8_8_ = puVar10[1];
  *puVar10 = pp_Var1;
  puVar10[1] = 0;
  *(char *)pp_Var1 = '\0';
  plVar9 = (long *)std::__cxx11::string::append(local_868);
  psVar3 = &local_6b0.m_tag._M_string_length;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar12) {
    local_6b0.m_tag._M_string_length = *psVar12;
    local_6b0.m_tag.field_2._M_allocated_capacity = plVar9[3];
    local_6b0._vptr_TAG = (_func_int **)psVar3;
  }
  else {
    local_6b0.m_tag._M_string_length = *psVar12;
    local_6b0._vptr_TAG = (_func_int **)*plVar9;
  }
  local_6b0.m_tag._M_dataplus._M_p = (pointer)plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((undefined1 *)local_868._0_8_ != local_868 + 0x10) {
    operator_delete((void *)local_868._0_8_,(ulong)(local_868._16_8_ + 1));
  }
  if (local_8a8 != local_898) {
    operator_delete(local_8a8,local_898[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  if (local_888[0] != local_878) {
    operator_delete(local_888[0],local_878[0] + 1);
  }
  if (bVar4) {
    local_8f0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8f0,local_6b0._vptr_TAG,
               local_6b0.m_tag._M_dataplus._M_p + (long)local_6b0._vptr_TAG);
  }
  else {
    local_8f0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"");
  }
  pHVar15 = local_8d0;
  HttpMessage::createResponse((string *)local_868,iVar6,&local_8f0);
  socket_send(pHVar15->m_socket,(char *)local_868._0_8_,local_868._8_8_);
  if ((undefined1 *)local_868._0_8_ != local_868 + 0x10) {
    operator_delete((void *)local_868._0_8_,(ulong)(local_868._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  socket_close(pHVar15->m_socket);
  if (local_6b0._vptr_TAG != (_func_int **)psVar3) {
    operator_delete(local_6b0._vptr_TAG,local_6b0.m_tag._M_string_length + 1);
  }
  HTML::TAG::~TAG(&local_1e8);
  if (local_8c8 != local_8b8) {
    operator_delete(local_8c8,local_8b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_370);
  std::ios_base::~ios_base(aiStack_2f0);
  std::__cxx11::stringstream::~stringstream(local_4f8);
  std::ios_base::~ios_base(aiStack_478);
  return;
}

Assistant:

void HttpConnection::processRequest(const HttpMessage &request) {
  int error = 200;
  std::stringstream h;
  std::stringstream b;
  std::string titleString = "QuickFIX Engine Web Interface";

  {
    HEAD head(h);
    head.text();
    {
      CENTER center(h);
      center.text();
      {
        TITLE title(h);
        title.text(titleString);
      }
      {
        H1 h1(h);
        h1.text(titleString);
      }
    }
    {
      CENTER center(h);
      center.text();
      {
        A a(h);
        a.href("/").text("HOME");
      }
      h << NBSP;
      {
        A a(h);
        a.href(request.toString()).text("RELOAD");
      }
    }
    HR hr(h);
    hr.text();
  }

  BODY body(b);
  body.text();

  try {
    if (request.getRootString() == "/") {
      processRoot(request, h, b);
    } else if (request.getRootString() == "/resetSessions") {
      processResetSessions(request, h, b);
    } else if (request.getRootString() == "/refreshSessions") {
      processRefreshSessions(request, h, b);
    } else if (request.getRootString() == "/enableSessions") {
      processEnableSessions(request, h, b);
    } else if (request.getRootString() == "/disableSessions") {
      processDisableSessions(request, h, b);
    } else if (request.getRootString() == "/session") {
      processSession(request, h, b);
    } else if (request.getRootString() == "/resetSession") {
      processResetSession(request, h, b);
    } else if (request.getRootString() == "/refreshSession") {
      processRefreshSession(request, h, b);
    } else {
      error = 404;
    }
  } catch (std::exception &e) {
    error = 400;
    b << e.what();
  }

  std::string response = "<HTML>" + h.str() + b.str() + "</HTML>";
  send(HttpMessage::createResponse(error, error == 200 ? response : ""));

  disconnect();
}